

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::SerializeMapEntry
               (FieldDescriptor *field,MapKey *key,MapValueRef *value,CodedOutputStream *output)

{
  FieldDescriptor *field_00;
  long lVar1;
  bool bVar2;
  Type TVar3;
  uint32 uVar4;
  int32 iVar5;
  int value_00;
  Descriptor *pDVar6;
  size_t sVar7;
  size_t sVar8;
  LogMessage *other;
  string *psVar9;
  uint64 uVar10;
  int64 iVar11;
  MessageLite *pMVar12;
  float value_01;
  double value_02;
  LogFinisher local_69;
  LogMessage local_68;
  
  pDVar6 = FieldDescriptor::message_type(field);
  field_00 = *(FieldDescriptor **)(pDVar6 + 0x30);
  pDVar6 = FieldDescriptor::message_type(field);
  lVar1 = *(long *)(pDVar6 + 0x30);
  WireFormatLite::WriteTag(*(int *)(field + 0x38),WIRETYPE_LENGTH_DELIMITED,output);
  sVar7 = MapKeyDataOnlyByteSize(field_00,key);
  sVar8 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar1 + 0xa8),value);
  io::CodedOutputStream::WriteVarint32(output,(int)sVar8 + (int)sVar7 + 2);
  TVar3 = FieldDescriptor::type(field_00);
  switch(TVar3) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x34e);
    other = LogMessage::operator<<(&local_68,"Unsupported");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_68);
    break;
  case TYPE_INT64:
    iVar11 = MapKey::GetInt64Value(key);
    WireFormatLite::WriteInt64(1,iVar11,output);
    break;
  case TYPE_UINT64:
    uVar10 = MapKey::GetUInt64Value(key);
    WireFormatLite::WriteUInt64(1,uVar10,output);
    break;
  case TYPE_INT32:
    iVar5 = MapKey::GetInt32Value(key);
    WireFormatLite::WriteInt32(1,iVar5,output);
    break;
  case TYPE_FIXED64:
    uVar10 = MapKey::GetUInt64Value(key);
    WireFormatLite::WriteFixed64(1,uVar10,output);
    break;
  case TYPE_FIXED32:
    uVar4 = MapKey::GetUInt32Value(key);
    WireFormatLite::WriteFixed32(1,uVar4,output);
    break;
  case TYPE_BOOL:
    bVar2 = MapKey::GetBoolValue(key);
    WireFormatLite::WriteBool(1,bVar2,output);
    break;
  case TYPE_STRING:
    psVar9 = MapKey::GetStringValue_abi_cxx11_(key);
    WireFormatLite::WriteString(1,psVar9,output);
    break;
  case TYPE_UINT32:
    uVar4 = MapKey::GetUInt32Value(key);
    WireFormatLite::WriteUInt32(1,uVar4,output);
    break;
  case TYPE_SFIXED32:
    iVar5 = MapKey::GetInt32Value(key);
    WireFormatLite::WriteSFixed32(1,iVar5,output);
    break;
  case TYPE_SFIXED64:
    iVar11 = MapKey::GetInt64Value(key);
    WireFormatLite::WriteSFixed64(1,iVar11,output);
    break;
  case TYPE_SINT32:
    iVar5 = MapKey::GetInt32Value(key);
    WireFormatLite::WriteSInt32(1,iVar5,output);
    break;
  case MAX_TYPE:
    iVar11 = MapKey::GetInt64Value(key);
    WireFormatLite::WriteSInt64(1,iVar11,output);
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)(lVar1 + 0xa8));
  switch(TVar3) {
  case TYPE_DOUBLE:
    value_02 = MapValueRef::GetDoubleValue(value);
    WireFormatLite::WriteDouble(2,value_02,output);
    break;
  case TYPE_FLOAT:
    value_01 = MapValueRef::GetFloatValue(value);
    WireFormatLite::WriteFloat(2,value_01,output);
    break;
  case TYPE_INT64:
    iVar11 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteInt64(2,iVar11,output);
    break;
  case TYPE_UINT64:
    uVar10 = MapValueRef::GetUInt64Value(value);
    WireFormatLite::WriteUInt64(2,uVar10,output);
    break;
  case TYPE_INT32:
    iVar5 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteInt32(2,iVar5,output);
    break;
  case TYPE_FIXED64:
    uVar10 = MapValueRef::GetUInt64Value(value);
    WireFormatLite::WriteFixed64(2,uVar10,output);
    break;
  case TYPE_FIXED32:
    uVar4 = MapValueRef::GetUInt32Value(value);
    WireFormatLite::WriteFixed32(2,uVar4,output);
    break;
  case TYPE_BOOL:
    bVar2 = MapValueRef::GetBoolValue(value);
    WireFormatLite::WriteBool(2,bVar2,output);
    break;
  case TYPE_STRING:
    psVar9 = MapValueRef::GetStringValue_abi_cxx11_(value);
    WireFormatLite::WriteString(2,psVar9,output);
    break;
  case TYPE_GROUP:
    pMVar12 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    WireFormatLite::WriteGroup(2,pMVar12,output);
    break;
  case TYPE_MESSAGE:
    pMVar12 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    WireFormatLite::WriteMessage(2,pMVar12,output);
    break;
  case TYPE_BYTES:
    psVar9 = MapValueRef::GetStringValue_abi_cxx11_(value);
    WireFormatLite::WriteBytes(2,psVar9,output);
    break;
  case TYPE_UINT32:
    uVar4 = MapValueRef::GetUInt32Value(value);
    WireFormatLite::WriteUInt32(2,uVar4,output);
    break;
  case TYPE_ENUM:
    value_00 = MapValueRef::GetEnumValue(value);
    WireFormatLite::WriteEnum(2,value_00,output);
    break;
  case TYPE_SFIXED32:
    iVar5 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteSFixed32(2,iVar5,output);
    break;
  case TYPE_SFIXED64:
    iVar11 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteSFixed64(2,iVar11,output);
    break;
  case TYPE_SINT32:
    iVar5 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteSInt32(2,iVar5,output);
    break;
  case MAX_TYPE:
    iVar11 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteSInt64(2,iVar11,output);
  }
  return;
}

Assistant:

static void SerializeMapEntry(const FieldDescriptor* field, const MapKey& key,
                              const MapValueRef& value,
                              io::CodedOutputStream* output) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  WireFormatLite::WriteTag(field->number(),
                           WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  output->WriteVarint32(size);
  SerializeMapKeyWithCachedSizes(key_field, key, output);
  SerializeMapValueRefWithCachedSizes(value_field, value, output);
}